

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cameras.h
# Opt level: O1

void __thiscall
pbrt::ProjectiveCamera::ProjectiveCamera
          (ProjectiveCamera *this,CameraBaseParameters *baseParameters,Transform *screenFromCamera,
          Bounds2f *screenWindow,Float lensRadius,Float focalDistance)

{
  undefined8 uVar1;
  undefined1 auVar2 [16];
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined1 auVar17 [16];
  Transform rasterFromNDC;
  Transform NDCFromScreen;
  Transform local_588;
  Transform local_508;
  Transform local_480;
  Transform local_400;
  CameraBaseParameters local_380;
  
  memcpy(&local_380,baseParameters,0x340);
  local_380.film.super_TaggedPointer<pbrt::RGBFilm,_pbrt::GBufferFilm>.bits =
       (TaggedPointer<pbrt::RGBFilm,_pbrt::GBufferFilm>)
       (baseParameters->film).super_TaggedPointer<pbrt::RGBFilm,_pbrt::GBufferFilm>.bits;
  local_380.medium.
  super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
  .bits = (TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
           )(baseParameters->medium).
            super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
            .bits;
  CameraBase::CameraBase(&this->super_CameraBase,&local_380);
  uVar1 = *(undefined8 *)(screenFromCamera->m).m[0];
  uVar3 = *(undefined8 *)((screenFromCamera->m).m[0] + 2);
  uVar4 = *(undefined8 *)(screenFromCamera->m).m[1];
  uVar5 = *(undefined8 *)((screenFromCamera->m).m[1] + 2);
  uVar6 = *(undefined8 *)(screenFromCamera->m).m[2];
  uVar7 = *(undefined8 *)((screenFromCamera->m).m[2] + 2);
  uVar8 = *(undefined8 *)(screenFromCamera->m).m[3];
  uVar9 = *(undefined8 *)((screenFromCamera->m).m[3] + 2);
  uVar10 = *(undefined8 *)((screenFromCamera->mInv).m[0] + 2);
  uVar11 = *(undefined8 *)(screenFromCamera->mInv).m[1];
  uVar12 = *(undefined8 *)((screenFromCamera->mInv).m[1] + 2);
  uVar13 = *(undefined8 *)(screenFromCamera->mInv).m[2];
  uVar14 = *(undefined8 *)((screenFromCamera->mInv).m[2] + 2);
  uVar15 = *(undefined8 *)(screenFromCamera->mInv).m[3];
  uVar16 = *(undefined8 *)((screenFromCamera->mInv).m[3] + 2);
  *(undefined8 *)(this->screenFromCamera).mInv.m[0] = *(undefined8 *)(screenFromCamera->mInv).m[0];
  *(undefined8 *)((this->screenFromCamera).mInv.m[0] + 2) = uVar10;
  *(undefined8 *)(this->screenFromCamera).mInv.m[1] = uVar11;
  *(undefined8 *)((this->screenFromCamera).mInv.m[1] + 2) = uVar12;
  *(undefined8 *)(this->screenFromCamera).mInv.m[2] = uVar13;
  *(undefined8 *)((this->screenFromCamera).mInv.m[2] + 2) = uVar14;
  *(undefined8 *)(this->screenFromCamera).mInv.m[3] = uVar15;
  *(undefined8 *)((this->screenFromCamera).mInv.m[3] + 2) = uVar16;
  *(undefined8 *)(this->screenFromCamera).m.m[0] = uVar1;
  *(undefined8 *)((this->screenFromCamera).m.m[0] + 2) = uVar3;
  *(undefined8 *)(this->screenFromCamera).m.m[1] = uVar4;
  *(undefined8 *)((this->screenFromCamera).m.m[1] + 2) = uVar5;
  *(undefined8 *)(this->screenFromCamera).m.m[2] = uVar6;
  *(undefined8 *)((this->screenFromCamera).m.m[2] + 2) = uVar7;
  *(undefined8 *)(this->screenFromCamera).m.m[3] = uVar8;
  *(undefined8 *)((this->screenFromCamera).m.m[3] + 2) = uVar9;
  Transform::Transform(&this->cameraFromRaster);
  Transform::Transform(&this->rasterFromScreen);
  Transform::Transform(&this->screenFromRaster);
  this->lensRadius = lensRadius;
  this->focalDistance = focalDistance;
  Scale(&local_480,
        1.0 / ((screenWindow->pMax).super_Tuple2<pbrt::Point2,_float>.x -
              (screenWindow->pMin).super_Tuple2<pbrt::Point2,_float>.x),
        1.0 / ((screenWindow->pMax).super_Tuple2<pbrt::Point2,_float>.y -
              (screenWindow->pMin).super_Tuple2<pbrt::Point2,_float>.y),1.0);
  auVar17 = vinsertps_avx((undefined1  [16])*screenWindow,
                          ZEXT416((uint)(screenWindow->pMax).super_Tuple2<pbrt::Point2,_float>.y),
                          0x10);
  auVar2._8_4_ = 0x80000000;
  auVar2._0_8_ = 0x8000000080000000;
  auVar2._12_4_ = 0x80000000;
  auVar17 = vxorps_avx512vl(auVar17,auVar2);
  local_508.m.m[0]._0_8_ = vmovlps_avx(auVar17);
  local_508.m.m[0]._8_8_ = (ulong)(uint)local_508.m.m[0][3] << 0x20;
  Translate((Vector3f *)&local_508);
  Transform::operator*(&local_400,&local_480,&local_588);
  uVar1 = *(undefined8 *)
           ((this->super_CameraBase).film.super_TaggedPointer<pbrt::RGBFilm,_pbrt::GBufferFilm>.bits
           & 0xffffffffffff);
  Scale(&local_480,(float)(int)uVar1,(float)-(int)((ulong)uVar1 >> 0x20),1.0);
  Transform::operator*(&local_588,&local_480,&local_400);
  *(undefined8 *)(this->rasterFromScreen).mInv.m[0] = local_588.mInv.m[0]._0_8_;
  *(undefined8 *)((this->rasterFromScreen).mInv.m[0] + 2) = local_588.mInv.m[0]._8_8_;
  *(undefined8 *)(this->rasterFromScreen).mInv.m[1] = local_588.mInv.m[1]._0_8_;
  *(undefined8 *)((this->rasterFromScreen).mInv.m[1] + 2) = local_588.mInv.m[1]._8_8_;
  *(undefined8 *)(this->rasterFromScreen).mInv.m[2] = local_588.mInv.m[2]._0_8_;
  *(undefined8 *)((this->rasterFromScreen).mInv.m[2] + 2) = local_588.mInv.m[2]._8_8_;
  *(undefined8 *)(this->rasterFromScreen).mInv.m[3] = local_588.mInv.m[3]._0_8_;
  *(undefined8 *)((this->rasterFromScreen).mInv.m[3] + 2) = local_588.mInv.m[3]._8_8_;
  *(undefined8 *)(this->rasterFromScreen).m.m[0] = local_588.m.m[0]._0_8_;
  *(undefined8 *)((this->rasterFromScreen).m.m[0] + 2) = local_588.m.m[0]._8_8_;
  *(undefined8 *)(this->rasterFromScreen).m.m[1] = local_588.m.m[1]._0_8_;
  *(undefined8 *)((this->rasterFromScreen).m.m[1] + 2) = local_588.m.m[1]._8_8_;
  *(undefined8 *)(this->rasterFromScreen).m.m[2] = local_588.m.m[2]._0_8_;
  *(undefined8 *)((this->rasterFromScreen).m.m[2] + 2) = local_588.m.m[2]._8_8_;
  *(undefined8 *)(this->rasterFromScreen).m.m[3] = local_588.m.m[3]._0_8_;
  *(undefined8 *)((this->rasterFromScreen).m.m[3] + 2) = local_588.m.m[3]._8_8_;
  local_588.m.m[0]._0_8_ = *(undefined8 *)(this->rasterFromScreen).mInv.m[0];
  local_588.m.m[0]._8_8_ = *(undefined8 *)((this->rasterFromScreen).mInv.m[0] + 2);
  local_588.m.m[1]._0_8_ = *(undefined8 *)(this->rasterFromScreen).mInv.m[1];
  local_588.m.m[1]._8_8_ = *(undefined8 *)((this->rasterFromScreen).mInv.m[1] + 2);
  local_588.m.m[2]._0_8_ = *(undefined8 *)(this->rasterFromScreen).mInv.m[2];
  local_588.m.m[2]._8_8_ = *(undefined8 *)((this->rasterFromScreen).mInv.m[2] + 2);
  local_588.m.m[3]._0_8_ = *(undefined8 *)(this->rasterFromScreen).mInv.m[3];
  local_588.m.m[3]._8_8_ = *(undefined8 *)((this->rasterFromScreen).mInv.m[3] + 2);
  local_588.mInv.m[0]._0_8_ = *(undefined8 *)(this->rasterFromScreen).m.m[0];
  local_588.mInv.m[0]._8_8_ = *(undefined8 *)((this->rasterFromScreen).m.m[0] + 2);
  local_588.mInv.m[1]._0_8_ = *(undefined8 *)(this->rasterFromScreen).m.m[1];
  local_588.mInv.m[1]._8_8_ = *(undefined8 *)((this->rasterFromScreen).m.m[1] + 2);
  local_588.mInv.m[2]._0_8_ = *(undefined8 *)(this->rasterFromScreen).m.m[2];
  local_588.mInv.m[2]._8_8_ = *(undefined8 *)((this->rasterFromScreen).m.m[2] + 2);
  local_588.mInv.m[3]._0_8_ = *(undefined8 *)(this->rasterFromScreen).m.m[3];
  local_588.mInv.m[3]._8_8_ = *(undefined8 *)((this->rasterFromScreen).m.m[3] + 2);
  *(undefined8 *)(this->screenFromRaster).mInv.m[0] = local_588.mInv.m[0]._0_8_;
  *(undefined8 *)((this->screenFromRaster).mInv.m[0] + 2) = local_588.mInv.m[0]._8_8_;
  *(undefined8 *)(this->screenFromRaster).mInv.m[1] = local_588.mInv.m[1]._0_8_;
  *(undefined8 *)((this->screenFromRaster).mInv.m[1] + 2) = local_588.mInv.m[1]._8_8_;
  *(undefined8 *)(this->screenFromRaster).mInv.m[2] = local_588.mInv.m[2]._0_8_;
  *(undefined8 *)((this->screenFromRaster).mInv.m[2] + 2) = local_588.mInv.m[2]._8_8_;
  *(undefined8 *)(this->screenFromRaster).mInv.m[3] = local_588.mInv.m[3]._0_8_;
  *(undefined8 *)((this->screenFromRaster).mInv.m[3] + 2) = local_588.mInv.m[3]._8_8_;
  *(undefined8 *)(this->screenFromRaster).m.m[0] = local_588.m.m[0]._0_8_;
  *(undefined8 *)((this->screenFromRaster).m.m[0] + 2) = local_588.m.m[0]._8_8_;
  *(undefined8 *)(this->screenFromRaster).m.m[1] = local_588.m.m[1]._0_8_;
  *(undefined8 *)((this->screenFromRaster).m.m[1] + 2) = local_588.m.m[1]._8_8_;
  *(undefined8 *)(this->screenFromRaster).m.m[2] = local_588.m.m[2]._0_8_;
  *(undefined8 *)((this->screenFromRaster).m.m[2] + 2) = local_588.m.m[2]._8_8_;
  *(undefined8 *)(this->screenFromRaster).m.m[3] = local_588.m.m[3]._0_8_;
  *(undefined8 *)((this->screenFromRaster).m.m[3] + 2) = local_588.m.m[3]._8_8_;
  local_508.m.m[0]._0_8_ = *(undefined8 *)(screenFromCamera->mInv).m[0];
  local_508.m.m[0]._8_8_ = *(undefined8 *)((screenFromCamera->mInv).m[0] + 2);
  local_508.m.m[1]._0_8_ = *(undefined8 *)(screenFromCamera->mInv).m[1];
  local_508.m.m[1]._8_8_ = *(undefined8 *)((screenFromCamera->mInv).m[1] + 2);
  local_508.m.m[2]._0_8_ = *(undefined8 *)(screenFromCamera->mInv).m[2];
  local_508.m.m[2]._8_8_ = *(undefined8 *)((screenFromCamera->mInv).m[2] + 2);
  local_508.m.m[3]._0_8_ = *(undefined8 *)(screenFromCamera->mInv).m[3];
  local_508.m.m[3]._8_8_ = *(undefined8 *)((screenFromCamera->mInv).m[3] + 2);
  local_508.mInv.m[0]._0_8_ = *(undefined8 *)(screenFromCamera->m).m[0];
  local_508.mInv.m[0]._8_8_ = *(undefined8 *)((screenFromCamera->m).m[0] + 2);
  local_508.mInv.m[1]._0_8_ = *(undefined8 *)(screenFromCamera->m).m[1];
  local_508.mInv.m[1]._8_8_ = *(undefined8 *)((screenFromCamera->m).m[1] + 2);
  local_508.mInv.m[2]._0_8_ = *(undefined8 *)(screenFromCamera->m).m[2];
  local_508.mInv.m[2]._8_8_ = *(undefined8 *)((screenFromCamera->m).m[2] + 2);
  local_508.mInv.m[3]._0_8_ = *(undefined8 *)(screenFromCamera->m).m[3];
  local_508.mInv.m[3]._8_8_ = *(undefined8 *)((screenFromCamera->m).m[3] + 2);
  Transform::operator*(&local_588,&local_508,&this->screenFromRaster);
  *(undefined8 *)(this->cameraFromRaster).mInv.m[0] = local_588.mInv.m[0]._0_8_;
  *(undefined8 *)((this->cameraFromRaster).mInv.m[0] + 2) = local_588.mInv.m[0]._8_8_;
  *(undefined8 *)(this->cameraFromRaster).mInv.m[1] = local_588.mInv.m[1]._0_8_;
  *(undefined8 *)((this->cameraFromRaster).mInv.m[1] + 2) = local_588.mInv.m[1]._8_8_;
  *(undefined8 *)(this->cameraFromRaster).mInv.m[2] = local_588.mInv.m[2]._0_8_;
  *(undefined8 *)((this->cameraFromRaster).mInv.m[2] + 2) = local_588.mInv.m[2]._8_8_;
  *(undefined8 *)(this->cameraFromRaster).mInv.m[3] = local_588.mInv.m[3]._0_8_;
  *(undefined8 *)((this->cameraFromRaster).mInv.m[3] + 2) = local_588.mInv.m[3]._8_8_;
  *(undefined8 *)(this->cameraFromRaster).m.m[0] = local_588.m.m[0]._0_8_;
  *(undefined8 *)((this->cameraFromRaster).m.m[0] + 2) = local_588.m.m[0]._8_8_;
  *(undefined8 *)(this->cameraFromRaster).m.m[1] = local_588.m.m[1]._0_8_;
  *(undefined8 *)((this->cameraFromRaster).m.m[1] + 2) = local_588.m.m[1]._8_8_;
  *(undefined8 *)(this->cameraFromRaster).m.m[2] = local_588.m.m[2]._0_8_;
  *(undefined8 *)((this->cameraFromRaster).m.m[2] + 2) = local_588.m.m[2]._8_8_;
  *(undefined8 *)(this->cameraFromRaster).m.m[3] = local_588.m.m[3]._0_8_;
  *(undefined8 *)((this->cameraFromRaster).m.m[3] + 2) = local_588.m.m[3]._8_8_;
  return;
}

Assistant:

ProjectiveCamera(CameraBaseParameters baseParameters,
                     const Transform &screenFromCamera, const Bounds2f &screenWindow,
                     Float lensRadius, Float focalDistance)
        : CameraBase(baseParameters),
          screenFromCamera(screenFromCamera),
          lensRadius(lensRadius),
          focalDistance(focalDistance) {
        // Compute projective camera transformations
        // Compute projective camera screen transformations
        Transform NDCFromScreen =
            Scale(1 / (screenWindow.pMax.x - screenWindow.pMin.x),
                  1 / (screenWindow.pMax.y - screenWindow.pMin.y), 1) *
            Translate(Vector3f(-screenWindow.pMin.x, -screenWindow.pMax.y, 0));
        Transform rasterFromNDC =
            Scale(film.FullResolution().x, -film.FullResolution().y, 1);
        rasterFromScreen = rasterFromNDC * NDCFromScreen;
        screenFromRaster = Inverse(rasterFromScreen);

        cameraFromRaster = Inverse(screenFromCamera) * screenFromRaster;
    }